

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint ** Extra_TruthPerm54(void)

{
  uint uVar1;
  uint **ppuVar2;
  uint **ppuVar3;
  long lVar4;
  uint uTruth;
  
  ppuVar2 = (uint **)malloc(0x180000);
  *ppuVar2 = (uint *)(ppuVar2 + 0x10000);
  ppuVar3 = ppuVar2 + 0x10002;
  lVar4 = 1;
  do {
    ppuVar2[lVar4] = (uint *)ppuVar3;
    lVar4 = lVar4 + 1;
    ppuVar3 = ppuVar3 + 2;
  } while (lVar4 != 0x10000);
  uTruth = 0;
  lVar4 = 0;
  do {
    uVar1 = Extra_TruthPerm5One(uTruth,0x17);
    *ppuVar2[lVar4] = uVar1;
    uVar1 = Extra_TruthPerm5One(uTruth,0x1b);
    ppuVar2[lVar4][1] = uVar1;
    uVar1 = Extra_TruthPerm5One(uTruth,0x1d);
    ppuVar2[lVar4][2] = uVar1;
    uVar1 = Extra_TruthPerm5One(uTruth,0x1e);
    ppuVar2[lVar4][3] = uVar1;
    lVar4 = lVar4 + 1;
    uTruth = uTruth + 0x10001;
  } while (lVar4 != 0x10000);
  return ppuVar2;
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}